

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O2

void http_rd_cancel(nni_aio *aio,void *arg,int rv)

{
  int iVar1;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0x3e0));
  if (*(nni_aio **)((long)arg + 0x40) == aio) {
    *(undefined8 *)((long)arg + 0x40) = 0;
    nni_aio_abort((nni_aio *)((long)arg + 0x50),rv);
  }
  else {
    iVar1 = nni_aio_list_active(aio);
    if (iVar1 == 0) goto LAB_001384ab;
    nni_aio_list_remove(aio);
  }
  nni_aio_finish_error(aio,rv);
LAB_001384ab:
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x3e0));
  return;
}

Assistant:

static void
http_rd_cancel(nni_aio *aio, void *arg, int rv)
{
	nni_http_conn *conn = arg;

	nni_mtx_lock(&conn->mtx);
	if (aio == conn->rd_uaio) {
		conn->rd_uaio = NULL;
		nni_aio_abort(&conn->rd_aio, rv);
		nni_aio_finish_error(aio, rv);
	} else if (nni_aio_list_active(aio)) {
		nni_aio_list_remove(aio);
		nni_aio_finish_error(aio, rv);
	}
	nni_mtx_unlock(&conn->mtx);
}